

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O0

void __thiscall
QAnimationGroup::insertAnimation(QAnimationGroup *this,int index,QAbstractAnimation *animation)

{
  QAnimationGroupPrivate *pQVar1;
  qsizetype qVar2;
  QAnimationGroup *t;
  Promoted<int,_long_long> PVar3;
  QAbstractAnimationPrivate *pQVar4;
  int in_ESI;
  QList<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  QAnimationGroup *oldGroup;
  QAnimationGroupPrivate *d;
  QObject *in_stack_ffffffffffffff88;
  QObject *in_stack_ffffffffffffff90;
  QMessageLogger *in_stack_ffffffffffffffa0;
  qsizetype local_38 [4];
  QAbstractAnimation *in_stack_ffffffffffffffe8;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  pQVar1 = d_func((QAnimationGroup *)0x67b953);
  if (-1 < local_c) {
    in_stack_ffffffffffffff90 = (QObject *)(long)local_c;
    qVar2 = QList<QAbstractAnimation_*>::size(&pQVar1->animations);
    if ((long)in_stack_ffffffffffffff90 <= qVar2) {
      t = QAbstractAnimation::group((QAbstractAnimation *)in_stack_ffffffffffffff90);
      if (t != (QAnimationGroup *)0x0) {
        removeAnimation((QAnimationGroup *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffffe8);
        local_38[0] = QList<QAbstractAnimation_*>::size(&pQVar1->animations);
        PVar3 = qMin<int,long_long>(&local_c,local_38);
        local_c = (int)PVar3;
      }
      QList<QAbstractAnimation_*>::insert
                (in_RDI,(qsizetype)in_stack_ffffffffffffff90,&t->super_QAbstractAnimation);
      pQVar4 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x67ba2b);
      pQVar4->group = (QAnimationGroup *)in_RDI;
      QObject::setParent(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      (*(pQVar1->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.
        _vptr_QObjectData[4])(pQVar1,(long)local_c);
      goto LAB_0067ba51;
    }
  }
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffa0,(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(char *)in_stack_ffffffffffffff88);
  QMessageLogger::warning
            ((QMessageLogger *)(local_38 + 1),
             "QAnimationGroup::insertAnimation: index is out of bounds");
LAB_0067ba51:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationGroup::insertAnimation(int index, QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QAnimationGroup::insertAnimation: index is out of bounds");
        return;
    }

    if (QAnimationGroup *oldGroup = animation->group()) {
        oldGroup->removeAnimation(animation);
        // ensure we don't insert out of bounds if oldGroup == this
        index = qMin(index, d->animations.size());
    }

    d->animations.insert(index, animation);
    QAbstractAnimationPrivate::get(animation)->group = this;
    // this will make sure that ChildAdded event is sent to 'this'
    animation->setParent(this);
    d->animationInsertedAt(index);
}